

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::generateTestData
          (TextureCubeMapArrayGenerateMipMapFilterable *this,int n_layer,uchar *data,int width,
          int height)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int n_component;
  long lVar5;
  ulong uVar6;
  
  if (0 < width) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      if (0 < height) {
        uVar6 = 0;
        uVar1 = uVar2;
        uVar4 = uVar3;
        do {
          lVar5 = 0;
          do {
            data[lVar5 + (ulong)uVar1] =
                 *(uchar *)((long)&m_layer_face_data +
                           lVar5 + (ulong)(uVar4 & 1) * 4 + (long)n_layer * 8);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          uVar6 = uVar6 + 1;
          uVar1 = uVar1 + width * 4;
          uVar4 = (uint)(byte)((char)uVar4 + 1);
        } while (uVar6 != (uint)height);
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + 4;
    } while (uVar3 != width);
  }
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::generateTestData(int n_layer, unsigned char* data, int width,
																   int height)
{
	DE_ASSERT(data != DE_NULL);

	for (int x = 0; x < width; ++x)
	{
		for (int y = 0; y < height; ++y)
		{
			for (int n_component = 0; n_component < m_n_components; ++n_component)
			{
				const unsigned int pixel_size = m_n_components;
				unsigned char*	 result_ptr = data + ((y * width + x) * pixel_size + n_component);
				unsigned int	   n_color	= ((x % m_n_colors_per_layer_face) + y) % m_n_colors_per_layer_face;

				*result_ptr = m_layer_face_data[n_layer][n_color][n_component];
			}
		}
	}
}